

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

int __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::Dimension
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra> *this)

{
  bool bVar1;
  int iVar2;
  int64_t iVar3;
  TPZCompElSide *pTVar4;
  TPZCompEl *pTVar5;
  long in_RDI;
  int el;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    iVar3 = TPZVec<TPZCompElSide>::NElements((TPZVec<TPZCompElSide> *)(in_RDI + 0x78));
    if (iVar3 <= local_14) {
      return -1;
    }
    pTVar4 = TPZVec<TPZCompElSide>::operator[]
                       ((TPZVec<TPZCompElSide> *)(in_RDI + 0x78),(long)local_14);
    bVar1 = TPZCompElSide::operator_cast_to_bool(pTVar4);
    if (bVar1) break;
    local_14 = local_14 + 1;
  }
  pTVar4 = TPZVec<TPZCompElSide>::operator[]
                     ((TPZVec<TPZCompElSide> *)(in_RDI + 0x78),(long)local_14);
  pTVar5 = TPZCompElSide::Element(pTVar4);
  iVar2 = (**(code **)(*(long *)pTVar5 + 0xb0))();
  return iVar2;
}

Assistant:

int TPZMultiphysicsCompEl<TGeometry>::Dimension() const {
    for(int el = 0; el < fElementVec.NElements(); el++)
    {
        if(fElementVec[el])
        {
            return fElementVec[el].Element()->Dimension();
        }
    }
    return -1;
}